

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_111d3fd::EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test::TestBody
          (EncodeTxbTest_DISABLED_SpeedTestGetNzMapContexts_Test *this)

{
  EncodeTxbTest *in_stack_00000080;
  
  EncodeTxbTest::SpeedTestGetNzMapContextsRun(in_stack_00000080);
  return;
}

Assistant:

TEST_P(EncodeTxbTest, DISABLED_SpeedTestGetNzMapContexts) {
  SpeedTestGetNzMapContextsRun();
}